

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.h
# Opt level: O1

void __thiscall
CNetAddr::
Unserialize<ParamsStream<ParamsStream<AutoFile&,CAddress::SerParams>&,CNetAddr::SerParams>>
          (CNetAddr *this,
          ParamsStream<ParamsStream<AutoFile_&,_CAddress::SerParams>_&,_CNetAddr::SerParams> *s)

{
  size_t in_RCX;
  long in_FS_OFFSET;
  Span<const_unsigned_char> ipv6;
  uint8_t serialized [16];
  uchar auStack_28 [16];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (s->m_params->enc == V2) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      UnserializeV2Stream<ParamsStream<ParamsStream<AutoFile&,CAddress::SerParams>&,CNetAddr::SerParams>>
                (this,s);
      return;
    }
  }
  else {
    AutoFile::read(s->m_substream->m_substream,(int)auStack_28,(void *)0x10,in_RCX);
    ipv6.m_size = 0x10;
    ipv6.m_data = auStack_28;
    SetLegacyIPv6(this,ipv6);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& s)
    {
        if (s.template GetParams<SerParams>().enc == Encoding::V2) {
            UnserializeV2Stream(s);
        } else {
            UnserializeV1Stream(s);
        }
    }